

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O2

int __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
::AddElement(RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
             *this,RTPIPv4Destination *elem)

{
  HashElement *pHVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  sa_family_t sVar5;
  in_port_t iVar6;
  in_addr iVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  in_addr iVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  int iVar17;
  HashElement *pHVar18;
  HashElement **ppHVar19;
  HashElement **ppHVar20;
  
  uVar2 = (ulong)elem->ip % 0x207d;
  ppHVar20 = this->table + uVar2;
  ppHVar19 = ppHVar20;
  do {
    pHVar1 = *ppHVar19;
    bVar4 = false;
    do {
      if ((bVar4) || (pHVar1 == (HashElement *)0x0)) {
        if (bVar4) {
          iVar17 = -4;
        }
        else {
          pHVar18 = (HashElement *)
                    operator_new(0x48,(this->super_RTPMemoryObject).mgr,this->memorytype);
          sVar5 = (elem->rtpaddr).sin_family;
          iVar6 = (elem->rtpaddr).sin_port;
          iVar7.s_addr = (elem->rtpaddr).sin_addr.s_addr;
          uVar8 = (elem->rtpaddr).sin_zero[0];
          uVar9 = (elem->rtpaddr).sin_zero[1];
          uVar10 = (elem->rtpaddr).sin_zero[2];
          uVar11 = (elem->rtpaddr).sin_zero[3];
          uVar3 = *(undefined8 *)((elem->rtpaddr).sin_zero + 4);
          iVar12.s_addr = (elem->rtcpaddr).sin_addr.s_addr;
          uVar13 = (elem->rtcpaddr).sin_zero[0];
          uVar14 = (elem->rtcpaddr).sin_zero[1];
          uVar15 = (elem->rtcpaddr).sin_zero[2];
          uVar16 = (elem->rtcpaddr).sin_zero[3];
          (pHVar18->element).ip = elem->ip;
          (pHVar18->element).rtpaddr.sin_family = sVar5;
          (pHVar18->element).rtpaddr.sin_port = iVar6;
          (pHVar18->element).rtpaddr.sin_addr = (in_addr)iVar7.s_addr;
          (pHVar18->element).rtpaddr.sin_zero[0] = uVar8;
          (pHVar18->element).rtpaddr.sin_zero[1] = uVar9;
          (pHVar18->element).rtpaddr.sin_zero[2] = uVar10;
          (pHVar18->element).rtpaddr.sin_zero[3] = uVar11;
          *(undefined8 *)((pHVar18->element).rtpaddr.sin_zero + 4) = uVar3;
          (pHVar18->element).rtcpaddr.sin_addr = (in_addr)iVar12.s_addr;
          (pHVar18->element).rtcpaddr.sin_zero[0] = uVar13;
          (pHVar18->element).rtcpaddr.sin_zero[1] = uVar14;
          (pHVar18->element).rtcpaddr.sin_zero[2] = uVar15;
          (pHVar18->element).rtcpaddr.sin_zero[3] = uVar16;
          *(undefined4 *)((pHVar18->element).rtcpaddr.sin_zero + 4) =
               *(undefined4 *)((elem->rtcpaddr).sin_zero + 4);
          pHVar18->hashprev = (HashElement *)0x0;
          pHVar18->hashnext = (HashElement *)0x0;
          pHVar18->listprev = (HashElement *)0x0;
          pHVar18->listnext = (HashElement *)0x0;
          pHVar18->hashindex = (int)uVar2;
          pHVar1 = *ppHVar20;
          *ppHVar20 = pHVar18;
          pHVar18->hashnext = pHVar1;
          if (pHVar1 != (HashElement *)0x0) {
            pHVar1->hashprev = pHVar18;
          }
          if (this->firsthashelem == (HashElement *)0x0) {
            this->firsthashelem = pHVar18;
          }
          else {
            pHVar1 = this->lasthashelem;
            pHVar1->listnext = pHVar18;
            pHVar18->listprev = pHVar1;
          }
          this->lasthashelem = pHVar18;
          iVar17 = 0;
        }
        return iVar17;
      }
    } while (((pHVar1->element).rtpaddr.sin_addr.s_addr == (elem->rtpaddr).sin_addr.s_addr) &&
            (bVar4 = true, (pHVar1->element).rtpaddr.sin_port == (elem->rtpaddr).sin_port));
    ppHVar19 = &pHVar1->hashnext;
  } while( true );
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::AddElement(const Element &elem)
{
	int index;
	bool found;
	HashElement *e,*newelem;
	
	index = GetIndex::GetIndex(elem);
	if (index >= hashsize)
		return ERR_RTP_HASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	e = table[index];
	found = false;
	while(!found && e != 0)
	{
		if (e->GetElement() == elem)
			found = true;
		else
			e = e->hashnext;
	}
	if (found)
		return ERR_RTP_HASHTABLE_ELEMENTALREADYEXISTS;
	
	// Okay, the key doesn't exist, so we can add the new element in the hash table
	
	newelem = RTPNew(GetMemoryManager(),memorytype) HashElement(elem,index);
	if (newelem == 0)
		return ERR_RTP_OUTOFMEM;

	e = table[index];
	table[index] = newelem;
	newelem->hashnext = e;
	if (e != 0)
		e->hashprev = newelem;
	
	// Now, we still got to add it to the linked list
	
	if (firsthashelem == 0)
	{
		firsthashelem = newelem;
		lasthashelem = newelem;
	}
	else // there already are some elements in the list
	{
		lasthashelem->listnext = newelem;
		newelem->listprev = lasthashelem;
		lasthashelem = newelem;
	}
	return 0;
}